

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O1

bool __thiscall TextField::update(TextField *this,TextEvent textEvent)

{
  Text *this_00;
  String *this_01;
  size_t sVar1;
  Vector2f VVar2;
  string s;
  locale local_60 [8];
  String local_58;
  string local_38;
  
  if ((((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') &&
      (this->isEditable == true)) && (this->selected == true)) {
    this_00 = &this->field;
    this_01 = sf::Text::getString(this_00);
    sf::String::operator_cast_to_string(&local_38,this_01);
    if (textEvent.unicode == 0x1b) {
      this->selected = false;
    }
    else if ((textEvent.unicode == 8) && (0 < this->caretPosition)) {
      std::__cxx11::string::erase((ulong)&local_38,(ulong)(this->caretPosition - 1));
      std::locale::locale(local_60);
      sf::String::String(&local_58,&local_38,local_60);
      sf::Text::setString(this_00,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
           *)local_58.m_string._M_dataplus._M_p != &local_58.m_string.field_2) {
        operator_delete(local_58.m_string._M_dataplus._M_p);
      }
      std::locale::~locale(local_60);
      sVar1 = (long)this->caretPosition - 1;
      this->caretPosition = (int)sVar1;
      VVar2 = sf::Text::findCharacterPos(this_00,sVar1);
      sf::Transformable::setPosition(&(this->caret).super_Shape.super_Transformable,VVar2.x,2.0);
    }
    else if ((textEvent.unicode - 0x20 < 0x5f) &&
            ((int)local_38._M_string_length < this->maxCharacters)) {
      std::__cxx11::string::insert((ulong)&local_38,(long)this->caretPosition,'\x01');
      std::locale::locale(local_60);
      sf::String::String(&local_58,&local_38,local_60);
      sf::Text::setString(this_00,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
           *)local_58.m_string._M_dataplus._M_p != &local_58.m_string.field_2) {
        operator_delete(local_58.m_string._M_dataplus._M_p);
      }
      std::locale::~locale(local_60);
      sVar1 = (long)this->caretPosition + 1;
      this->caretPosition = (int)sVar1;
      VVar2 = sf::Text::findCharacterPos(this_00,sVar1);
      sf::Transformable::setPosition(&(this->caret).super_Shape.super_Transformable,VVar2.x,2.0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return false;
}

Assistant:

bool TextField::update(Event::TextEvent textEvent) {
    if (visible && isEditable && selected) {
        string s = field.getString();
        if (textEvent.unicode == 8 && caretPosition > 0) {    // Backspace.
            s.erase(caretPosition - 1, 1);
            field.setString(s);
            --caretPosition;
            caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
        } else if (textEvent.unicode == 27) {    // Escape.
            selected = false;
        } else if (textEvent.unicode >= 32 && textEvent.unicode <= 126 && static_cast<int>(s.length()) < maxCharacters) {    // Printable character.
            s.insert(caretPosition, 1, static_cast<char>(textEvent.unicode));
            field.setString(s);
            ++caretPosition;
            caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
        }
    }
    return false;
}